

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureAllocator.h
# Opt level: O2

pointer __thiscall
SecureAllocator<unsigned_char>::allocate
          (SecureAllocator<unsigned_char> *this,size_type n,void *param_2)

{
  pointer pointer;
  SecureMemoryRegistry *this_00;
  
  pointer = (pointer)operator_new(n);
  this_00 = SecureMemoryRegistry::i();
  SecureMemoryRegistry::add(this_00,pointer,n);
  return pointer;
}

Assistant:

inline pointer allocate(size_type n, const void* = NULL)
	{
#ifdef SENSITIVE_NON_PAGED
		// Allocate memory on a page boundary
#ifndef _WIN32
		pointer r = (pointer) valloc(n * sizeof(T));
#else
		pointer r = (pointer) VirtualAlloc(NULL, n * sizeof(T), MEM_COMMIT | MEM_RESERVE, PAGE_READWRITE);
#endif

		if (r == NULL)
		{
			ERROR_MSG("Out of memory");

			return NULL;
		}

		// Lock the memory so it doesn't get swapped out
#ifndef _WIN32
		if (mlock((const void*) r, n * sizeof(T)) != 0)
#else
		if (VirtualLock((const void*) r, n * sizeof(T)) == 0)
#endif
		{
			ERROR_MSG("Could not allocate non-paged memory for secure storage");

			// Hmmm... best to not return any allocated space in this case
#ifndef _WIN32
			free(r);
#else
			VirtualFree((const void*) r, MEM_RELEASE);
#endif

			return NULL;
		}

		// Register the memory in the secure memory registry
		SecureMemoryRegistry::i()->add(r, n * sizeof(T));

		return r;
#else
		pointer r = (pointer)(::operator new(n * sizeof(T)));

		if (r == NULL)
		{
			ERROR_MSG("Out of memory");

			return NULL;
		}

		// Register the memory in the secure memory registry
		SecureMemoryRegistry::i()->add(r, n * sizeof(T));

		return r;
#endif // SENSITIVE_NON_PAGED
	}